

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O2

void decode_16(FILE *f,uint w,uint h)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  size_t __n;
  size_t __n_00;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  uint uVar10;
  uint local_44;
  uint local_40;
  
  if (pcx.encoding == '\0') {
    error("Unsupported PCX encoding scheme!");
  }
  else {
    if (pcx.encoding != '\x01') {
      error("Unsupported PCX encoding scheme!");
      return;
    }
    uVar10 = 0;
    local_40 = 0;
    local_44 = 0;
    pbVar9 = pcx_buf;
    do {
      uVar1 = fgetc((FILE *)f);
      if (uVar1 == 0xffffffff) break;
      uVar2 = 1;
      if ((~uVar1 & 0xc0) == 0) {
        uVar2 = uVar1 & 0x3f;
        uVar1 = fgetc((FILE *)f);
      }
      do {
        pcx_plane[uVar10 >> 3][local_44] = (uchar)uVar1;
        uVar10 = uVar10 + 8;
        if (w <= uVar10) {
          local_44 = local_44 + 1;
          uVar10 = 0;
          if (local_44 == pcx.np) {
            uVar10 = 0;
            for (uVar3 = 0; uVar3 != w + 7 >> 3; uVar3 = uVar3 + 1) {
              uVar6 = uVar10;
              for (uVar5 = 7; uVar5 != 0xffffffff; uVar5 = uVar5 - 1) {
                bVar8 = 0;
                bVar7 = 0;
                bVar4 = (byte)uVar5;
                switch(pcx.np) {
                case '\x04':
                  bVar7 = (pcx_plane[uVar3][3] >> (bVar4 & 0x1f) & 1) << 3;
                case '\x03':
                  bVar7 = bVar7 + (pcx_plane[uVar3][2] >> (bVar4 & 0x1f) & 1) * '\x04';
                case '\x02':
                  bVar8 = (pcx_plane[uVar3][1] >> (bVar4 & 0x1f)) * '\x02' & 2 | bVar7;
                case '\x01':
                  bVar8 = (pcx_plane[uVar3][0] >> (uVar5 & 0x1f) & 1) != 0 | bVar8;
                  break;
                default:
                  bVar8 = 0;
                }
                if (uVar6 < w) {
                  *pbVar9 = bVar8;
                  pbVar9 = pbVar9 + 1;
                }
                uVar6 = uVar6 + 1;
              }
              uVar10 = uVar10 + 8;
            }
            local_40 = local_40 + 1;
            uVar10 = 0;
            local_44 = 0;
          }
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    } while (local_40 < h);
  }
  uVar10 = 3 << (pcx.np & 0x1f);
  __n_00 = (size_t)(int)uVar10;
  __n = 0;
  if (uVar10 < 0x300) {
    __n = 0x300 - __n_00;
  }
  memset(pcx_pal[0] + __n_00,0,__n);
  memcpy(pcx_pal,pcx.colormap,__n_00);
  pcx_nb_colors = 0x10;
  return;
}

Assistant:

void
decode_16(FILE *f, unsigned int w, unsigned int h)
{
    int k;
	unsigned int i, j, n;
	unsigned int x, y, p;
	unsigned int c, pix;
	unsigned char *ptr;

	ptr = pcx_buf;
	x = 0;
	y = 0;
	p = 0;

	/* decode */
	switch (pcx.encoding) {
	case 0:
		/* raw */
		error("Unsupported PCX encoding scheme!");
		break;

	case 1:
		/* simple run-length encoding */
		do {
			/* get a char */
			c = fgetc(f);
			if (c == uEOF)
				break;

			/* check if it's a repeat command */
			if ((c & 0xC0) != 0xC0)
				i = 1;
			else {
				i = (c & 0x3F);
				c = fgetc(f);
			}

			/* unpack */
			do {
			    pcx_plane[x >> 3][p] = c;
				x += 8;

				/* end of line */
				if (x >= w) {
					x = 0;
					p++;

					/* plane to chunky conversion */
					if (p == pcx.np) {
						p = 0;
						n = (w + 7) >> 3;
						y++;

						/* loop */
						for (j = 0; j < n; j++) {
							for (k = 7; k >= 0; k--) {
								/* get pixel index */
								pix = 0;

								switch (pcx.np) {
								case 4:
									pix |= ((pcx_plane[j][3] >> k) & 0x01) << 3;
								case 3:
									pix |= ((pcx_plane[j][2] >> k) & 0x01) << 2;
								case 2:
									pix |= ((pcx_plane[j][1] >> k) & 0x01) << 1;
								case 1:
									pix |= ((pcx_plane[j][0] >> k) & 0x01);
									break;
								}

								/* store pixel */
								if (x < w)
									*ptr++ = pix;

								x++;
							}
						}
						x = 0;
					}
				}
			}
			while (--i);
		}
		while (y < h);
		break;

	default:
		error("Unsupported PCX encoding scheme!");
		return;
	}			

	/* get the palette */
	memset(pcx_pal, 0, 768);
	memcpy(pcx_pal, pcx.colormap, (1 << pcx.np) * 3);

	/* number of colors */
	pcx_nb_colors = 16;
}